

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O2

bool __thiscall
cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)>::parse<unsigned_long,cmake*>
          (cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)> *this,string *input,
          unsigned_long *index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *allArgs,cmake **state)

{
  unsigned_long uVar1;
  pointer pbVar2;
  char *pcVar3;
  bool bVar4;
  size_type sVar5;
  string *this_00;
  ulong uVar6;
  long lVar7;
  ParseMode parseState;
  string value;
  string buffer;
  ParseMode local_e4;
  undefined1 local_e0 [48];
  string local_b0;
  string *local_90;
  cmake **local_88;
  cmAlphaNum local_80;
  string local_50;
  
  local_e4 = 0;
  switch(*(int *)(this + 0x60)) {
  case 0:
    sVar5 = input->_M_string_length;
    if (sVar5 == *(size_type *)(this + 0x48)) {
      local_e0._0_8_ = local_e0 + 0x10;
      local_e0._8_8_ = (char *)0x0;
      local_e0[0x10] = '\0';
      bVar4 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
              ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                            *)(this + 0x68),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0,*state);
      goto LAB_002b2267;
    }
    local_e4 = 2;
    goto LAB_002b22a4;
  case 1:
  case 3:
    if (input->_M_string_length == *(size_type *)(this + 0x48)) {
      uVar6 = *index + 1;
      pbVar2 = (allArgs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((uVar6 < (ulong)((long)(allArgs->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5))
         && (*pbVar2[uVar6]._M_dataplus._M_p != '-')) {
        bVar4 = std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                              *)(this + 0x68),pbVar2 + uVar6,*state);
        local_e4 = (ParseMode)!bVar4;
        *index = uVar6;
        break;
      }
      if (*(int *)(this + 0x60) != 3) goto LAB_002b21f6;
      local_e0._0_8_ = local_e0 + 0x10;
      local_e0._8_8_ = (char *)0x0;
      local_e0[0x10] = '\0';
      bVar4 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
              ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                            *)(this + 0x68),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0,*state);
LAB_002b2267:
      local_e4 = (ParseMode)(bVar4 ^ 1);
    }
    else {
      cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
      ::extract_single_value
                ((string *)local_e0,
                 (cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                  *)this,input,&local_e4);
      if (local_e4 == 0) {
        bVar4 = std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                              *)(this + 0x68),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e0,*state);
        goto LAB_002b2267;
      }
    }
LAB_002b2270:
    this_00 = (string *)local_e0;
LAB_002b2275:
    std::__cxx11::string::~string((string *)this_00);
    break;
  case 2:
    if (input->_M_string_length != *(size_type *)(this + 0x48)) break;
    uVar1 = *index;
    uVar6 = uVar1 + 2;
    pbVar2 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar6 < (ulong)((long)(allArgs->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
      pcVar3 = pbVar2[uVar1 + 1]._M_dataplus._M_p;
      if ((*pcVar3 == '-') || (*pbVar2[uVar6]._M_dataplus._M_p == '-')) goto LAB_002b21f6;
      *index = uVar6;
      local_e0._0_8_ = pbVar2[uVar1 + 1]._M_string_length;
      local_80.View_._M_len = 1;
      local_80.View_._M_str = ";";
      local_e0._8_8_ = pcVar3;
      cmStrCat<std::__cxx11::string>(&local_b0,(cmAlphaNum *)local_e0,&local_80,pbVar2 + uVar6);
      bVar4 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
              ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                            *)(this + 0x68),&local_b0,*state);
      local_e4 = (ParseMode)!bVar4;
      this_00 = &local_b0;
      goto LAB_002b2275;
    }
LAB_002b21f6:
    local_e4 = 3;
    goto LAB_002b228e;
  case 4:
    if (input->_M_string_length != *(size_type *)(this + 0x48)) {
      cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
      ::extract_single_value
                ((string *)local_e0,
                 (cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                  *)this,input,&local_e4);
      if (local_e4 != 0) goto LAB_002b2270;
      bVar4 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
              ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                            *)(this + 0x68),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0,*state);
      goto LAB_002b2267;
    }
    uVar1 = *index;
    uVar6 = uVar1 + 1;
    pbVar2 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_90 = input;
    local_88 = state;
    if (((ulong)((long)(allArgs->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar6) ||
       (*pbVar2[uVar6]._M_dataplus._M_p == '-')) goto LAB_002b21f6;
    std::__cxx11::string::string((string *)&local_b0,(string *)(pbVar2 + uVar6));
    lVar7 = uVar1 * 0x20 + 0x40;
    while( true ) {
      pbVar2 = (allArgs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (((ulong)((long)(allArgs->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <=
           uVar6 + 1) || (**(char **)((long)&(pbVar2->_M_dataplus)._M_p + lVar7) == '-')) break;
      local_e0._0_8_ = local_b0._M_string_length;
      local_e0._8_8_ = local_b0._M_dataplus._M_p;
      local_80.View_._M_len = 1;
      local_80.View_._M_str = ";";
      cmStrCat<std::__cxx11::string>
                (&local_50,(cmAlphaNum *)local_e0,&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pbVar2->_M_dataplus)._M_p + lVar7));
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      lVar7 = lVar7 + 0x20;
      uVar6 = uVar6 + 1;
    }
    bVar4 = std::
            function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
            ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                          *)(this + 0x68),&local_b0,*local_88);
    local_e4 = (ParseMode)!bVar4;
    *index = uVar6;
    std::__cxx11::string::~string((string *)&local_b0);
    input = local_90;
    break;
  default:
    goto switchD_002b2012_default;
  }
  if (local_e4 == 3) {
LAB_002b228e:
    cmSystemTools::Error((string *)(this + 0x20));
  }
  else if (local_e4 == 2) {
    sVar5 = input->_M_string_length;
LAB_002b22a4:
    local_e0._0_8_ = &DAT_00000001;
    local_e0._8_8_ = "\'";
    local_80.View_._M_str = (input->_M_dataplus)._M_p;
    local_80.View_._M_len = sVar5;
    cmStrCat<char[2],std::__cxx11::string>
              (&local_b0,(cmAlphaNum *)local_e0,&local_80,(char (*) [2])0x655e14,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    cmSystemTools::Error(&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
switchD_002b2012_default:
  return local_e4 == 0;
}

Assistant:

bool parse(std::string const& input, T& index,
             std::vector<std::string> const& allArgs,
             CallState&&... state) const
  {
    ParseMode parseState = ParseMode::Valid;

    if (this->Type == Values::Zero) {
      if (input.size() == this->Name.size()) {
        parseState =
          this->StoreCall(std::string{}, std::forward<CallState>(state)...)
          ? ParseMode::Valid
          : ParseMode::Invalid;
      } else {
        parseState = ParseMode::SyntaxError;
      }

    } else if (this->Type == Values::One || this->Type == Values::ZeroOrOne) {
      if (input.size() == this->Name.size()) {
        auto nextValueIndex = index + 1;
        if (nextValueIndex >= allArgs.size() ||
            allArgs[nextValueIndex][0] == '-') {
          if (this->Type == Values::ZeroOrOne) {
            parseState =
              this->StoreCall(std::string{}, std::forward<CallState>(state)...)
              ? ParseMode::Valid
              : ParseMode::Invalid;
          } else {
            parseState = ParseMode::ValueError;
          }
        } else {
          parseState = this->StoreCall(allArgs[nextValueIndex],
                                       std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
          index = nextValueIndex;
        }
      } else {
        auto value = this->extract_single_value(input, parseState);
        if (parseState == ParseMode::Valid) {
          parseState =
            this->StoreCall(value, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    } else if (this->Type == Values::Two) {
      if (input.size() == this->Name.size()) {
        if (index + 2 >= allArgs.size() || allArgs[index + 1][0] == '-' ||
            allArgs[index + 2][0] == '-') {
          parseState = ParseMode::ValueError;
        } else {
          index += 2;
          parseState =
            this->StoreCall(cmStrCat(allArgs[index - 1], ";", allArgs[index]),
                            std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    } else if (this->Type == Values::OneOrMore) {
      if (input.size() == this->Name.size()) {
        auto nextValueIndex = index + 1;
        if (nextValueIndex >= allArgs.size() ||
            allArgs[nextValueIndex][0] == '-') {
          parseState = ParseMode::ValueError;
        } else {
          std::string buffer = allArgs[nextValueIndex++];
          while (nextValueIndex < allArgs.size() &&
                 allArgs[nextValueIndex][0] != '-') {
            buffer = cmStrCat(buffer, ";", allArgs[nextValueIndex++]);
          }
          parseState =
            this->StoreCall(buffer, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
          index = (nextValueIndex - 1);
        }
      } else {
        auto value = this->extract_single_value(input, parseState);
        if (parseState == ParseMode::Valid) {
          parseState =
            this->StoreCall(value, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    }

    if (parseState == ParseMode::SyntaxError) {
      cmSystemTools::Error(
        cmStrCat("'", input, "'", this->InvalidSyntaxMessage));
    } else if (parseState == ParseMode::ValueError) {
      cmSystemTools::Error(this->InvalidValueMessage);
    }
    return (parseState == ParseMode::Valid);
  }